

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O0

void create_camera_demon(obj *camera,int x,int y)

{
  boolean bVar1;
  int iVar2;
  monst *worm;
  obj *poVar3;
  char *str;
  char *local_30;
  char *local_28;
  monst *mtmp;
  int y_local;
  int x_local;
  obj *camera_local;
  
  iVar2 = rn2(3);
  if (iVar2 != 0) {
    return;
  }
  worm = makemon(mons + 0x34,level,x,y,0);
  if (worm == (monst *)0x0) {
    return;
  }
  if (worm->wormno == '\0') {
    if (((viz_array[worm->my][worm->mx] & 2U) != 0) ||
       ((((u.uprops[0x1e].intrinsic == 0 &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
        (((u.uprops[0x40].intrinsic != 0 ||
          ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
         (((worm->data->mflags3 & 0x200) != 0 && ((viz_array[worm->my][worm->mx] & 1U) != 0))))))))
    goto LAB_0020dfb5;
LAB_0020e042:
    if (((((worm->data->mflags1 & 0x10000) != 0) ||
         ((poVar3 = which_armor(worm,4), poVar3 != (obj *)0x0 &&
          (poVar3 = which_armor(worm,4), poVar3->otyp == 0x4f)))) ||
        (((((u.uprops[0x1e].intrinsic == 0 &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
            ((((u.uprops[0x19].intrinsic == 0 &&
               ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
              (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)))))) ||
          (u.uprops[0x19].blocked != 0)) &&
         (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
          (iVar2 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy), 0x40 < iVar2)))))) &&
       (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
        (bVar1 = match_warn_of_mon(worm), bVar1 == '\0')))) {
      local_28 = "Something";
      goto LAB_0020e296;
    }
  }
  else {
    bVar1 = worm_known(level,worm);
    if (bVar1 == '\0') goto LAB_0020e042;
LAB_0020dfb5:
    if (((((((*(uint *)&worm->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
          (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
        (((*(uint *)&worm->field_0x60 >> 7 & 1) != 0 || ((*(uint *)&worm->field_0x60 >> 9 & 1) != 0)
         ))) || (((byte)u._1052_1_ >> 5 & 1) != 0)) goto LAB_0020e042;
  }
  if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
     ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) {
    local_30 = "The picture-painting demon";
  }
  else {
    str = rndmonnam();
    local_30 = An(str);
  }
  local_28 = local_30;
LAB_0020e296:
  pline("%s is released!",local_28);
  *(uint *)&worm->field_0x60 =
       *(uint *)&worm->field_0x60 & 0xffbfffff |
       (uint)((*(uint *)&camera->field_0x4a & 1) == 0) << 0x16;
  set_malign(worm);
  return;
}

Assistant:

void create_camera_demon(struct obj *camera, int x, int y)
{
	struct monst *mtmp;

	if (!rn2(3) &&
	    (mtmp = makemon(&mons[PM_HOMUNCULUS], level, x, y, NO_MM_FLAGS)) != 0) {
	    pline("%s is released!",
		  !canspotmon(level, mtmp) ? "Something" :
		  Hallucination ? An(rndmonnam()) :
		  "The picture-painting demon");
	    mtmp->mpeaceful = !camera->cursed;
	    set_malign(mtmp);
	}
}